

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O1

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::Parenthesizer::~Parenthesizer
          (Parenthesizer *this)

{
  ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *pEVar1;
  Buffer<char> *pBVar2;
  size_t sVar3;
  
  pEVar1 = this->writer_;
  pEVar1->precedence_ = this->saved_precedence_;
  if (this->write_paren_ == true) {
    pBVar2 = pEVar1->writer_->buffer_;
    if (pBVar2->size_ == pBVar2->capacity_) {
      (**pBVar2->_vptr_Buffer)(pBVar2,pBVar2->size_ + 1);
    }
    sVar3 = pBVar2->size_;
    pBVar2->size_ = sVar3 + 1;
    pBVar2->ptr_[sVar3] = ')';
  }
  return;
}

Assistant:

ExprWriter<ExprTypes, VarNamer>::Parenthesizer::~Parenthesizer() {
  writer_.precedence_ = saved_precedence_;
  if (write_paren_)
    writer_.writer_ << ')';
}